

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

void __thiscall IR::EncodableOpnd<int>::DumpEncodable(EncodableOpnd<int> *this)

{
  if (this->name != (char16 *)0x0) {
    Output::Print(L"<%s> (value: 0x%X)",this->name,(ulong)(uint)this->m_value);
    return;
  }
  if (this->decodedValue != 0) {
    Output::Print(L"%d (0x%X) [encoded: 0x%X]",(ulong)(uint)this->decodedValue);
    return;
  }
  Output::Print(L"%d (0x%X)",(ulong)(uint)this->m_value,(ulong)(uint)this->m_value);
  return;
}

Assistant:

void EncodableOpnd<int32>::DumpEncodable() const
{
    if (name != nullptr)
    {
        Output::Print(_u("<%s> (value: 0x%X)"), name, m_value);
    }
    else if (decodedValue != 0)
    {
        Output::Print(_u("%d (0x%X) [encoded: 0x%X]"), decodedValue, decodedValue, m_value);
    }
    else
    {
        Output::Print(_u("%d (0x%X)"), m_value, m_value);
    }
}